

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O3

void __thiscall
adios2::aggregator::MPIChain::Init
          (MPIChain *this,size_t numAggregators,size_t subStreams,Comm *parentComm)

{
  pointer *ppuVar1;
  iterator __position;
  BufferSTL *this_00;
  _Head_base<0UL,_adios2::format::Buffer_*,_false> local_18;
  
  (this->super_MPIAggregator).m_NumAggregators = subStreams;
  if (subStreams == 0) {
    MPIAggregator::InitCommOnePerNode(&this->super_MPIAggregator,parentComm);
  }
  else {
    MPIAggregator::InitComm(&this->super_MPIAggregator,subStreams,parentComm);
    MPIAggregator::HandshakeRank(&this->super_MPIAggregator,0);
  }
  HandshakeLinks(this);
  if ((this->super_MPIAggregator).m_Rank < (this->super_MPIAggregator).m_Size) {
    this_00 = (BufferSTL *)operator_new(0x58);
    adios2::format::BufferSTL::BufferSTL(this_00);
    __position._M_current =
         (this->super_MPIAggregator).m_Buffers.
         super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_MPIAggregator).m_Buffers.
        super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_18._M_head_impl = (Buffer *)this_00;
      std::
      vector<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>,std::allocator<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>>>
      ::_M_realloc_insert<adios2::format::BufferSTL*>
                ((vector<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>,std::allocator<std::unique_ptr<adios2::format::Buffer,std::default_delete<adios2::format::Buffer>>>>
                  *)&(this->super_MPIAggregator).m_Buffers,__position,(BufferSTL **)&local_18);
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>.
      _M_t.
      super__Tuple_impl<0UL,_adios2::format::Buffer_*,_std::default_delete<adios2::format::Buffer>_>
      .super__Head_base<0UL,_adios2::format::Buffer_*,_false>._M_head_impl = (Buffer *)this_00;
      ppuVar1 = &(this->super_MPIAggregator).m_Buffers.
                 super__Vector_base<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>,_std::allocator<std::unique_ptr<adios2::format::Buffer,_std::default_delete<adios2::format::Buffer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return;
}

Assistant:

void MPIChain::Init(const size_t numAggregators, const size_t subStreams,
                    helper::Comm const &parentComm)
{
    /* numAggregators ignored here as BP3/BP4 uses substreams = aggregators */
    m_NumAggregators = subStreams;
    if (subStreams > 0)
    {
        InitComm(subStreams, parentComm);
        HandshakeRank(0);
    }
    else
    {
        InitCommOnePerNode(parentComm);
    }

    HandshakeLinks();

    // add a receiving buffer except for the last rank (only sends)
    if (m_Rank < m_Size)
    {
        m_Buffers.emplace_back(new format::BufferSTL()); // just one for now
    }
}